

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::ReadString(CodedInputStream *input,string *value)

{
  string *this;
  bool bVar1;
  int iVar2;
  char *__dest;
  uint32 local_3c;
  string *psStack_38;
  uint32 length;
  string *value_local;
  CodedInputStream *input_local;
  string *local_20;
  string *local_18;
  bool local_9;
  
  psStack_38 = value;
  value_local = (string *)input;
  bVar1 = io::CodedInputStream::ReadVarint32(input,&local_3c);
  this = value_local;
  if (bVar1) {
    local_18 = value_local;
    local_20 = psStack_38;
    input_local._4_4_ = local_3c;
    if ((int)local_3c < 0) {
      local_9 = false;
    }
    else {
      iVar2 = io::CodedInputStream::BufferSize((CodedInputStream *)value_local);
      if (iVar2 < (int)input_local._4_4_) {
        local_9 = io::CodedInputStream::ReadStringFallback
                            ((CodedInputStream *)this,local_20,input_local._4_4_);
      }
      else {
        STLStringResizeUninitialized(local_20,(long)(int)input_local._4_4_);
        if (0 < (int)input_local._4_4_) {
          __dest = string_as_array(local_20);
          memcpy(__dest,(void *)this->_M_string_length,(long)(int)input_local._4_4_);
          io::CodedInputStream::Advance((CodedInputStream *)this,input_local._4_4_);
        }
        local_9 = true;
      }
    }
    if (local_9 == false) {
      input_local._3_1_ = false;
    }
    else {
      input_local._3_1_ = true;
    }
  }
  else {
    input_local._3_1_ = false;
  }
  return input_local._3_1_;
}

Assistant:

bool WireFormatLite::ReadString(io::CodedInputStream* input,
                                string* value) {
  // String is for UTF-8 text only
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  if (!input->InternalReadStringInline(value, length)) return false;
  return true;
}